

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

QAction * __thiscall
QMenuPrivate::exec(QMenuPrivate *this,QPoint *p,QAction *action,PositionFunction positionFunction)

{
  QWidget *this_00;
  Data *pDVar1;
  PositionFunction positionFunction_00;
  int *piVar2;
  long in_RCX;
  QAction *pQVar3;
  long in_FS_OFFSET;
  undefined8 uVar4;
  undefined8 uVar5;
  _Manager_type p_Var6;
  _Invoker_type p_Var7;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::ensurePolished(this_00);
  QWidget::createWinId(this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEventLoop::QEventLoop((QEventLoop *)&local_48,(QObject *)0x0);
  this->eventLoop = (QEventLoop *)&local_48;
  p_Var6 = (_Manager_type)0x0;
  p_Var7 = (_Invoker_type)0x0;
  uVar4 = (void *)0x0;
  uVar5 = 0;
  if (*(code **)(in_RCX + 0x10) != (code *)0x0) {
    (**(code **)(in_RCX + 0x10))(&stack0xffffffffffffff98);
    p_Var6 = *(_Manager_type *)(in_RCX + 0x10);
    p_Var7 = *(_Invoker_type *)(in_RCX + 0x18);
  }
  positionFunction_00.super__Function_base._M_functor._8_8_ = uVar5;
  positionFunction_00.super__Function_base._M_functor._M_unused._M_object = (void *)uVar4;
  positionFunction_00.super__Function_base._M_manager = p_Var6;
  positionFunction_00._M_invoker = p_Var7;
  popup(this,p,action,positionFunction_00);
  if (p_Var6 != (_Manager_type)0x0) {
    (*p_Var6)((_Any_data *)&stack0xffffffffffffff98,(_Any_data *)&stack0xffffffffffffff98,
              __destroy_functor);
  }
  piVar2 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_00->super_QObject);
  if (this->eventLoop != (QEventLoop *)0x0) {
    QEventLoop::exec(this->eventLoop,0);
  }
  if (piVar2 == (int *)0x0) {
    pQVar3 = (QAction *)0x0;
  }
  else {
    if (piVar2[1] == 0) {
      pQVar3 = (QAction *)0x0;
    }
    else {
      pDVar1 = (this->syncAction).wp.d;
      if (pDVar1 == (Data *)0x0) {
        (this->syncAction).wp.d = (Data *)0x0;
        (this->syncAction).wp.value = (QObject *)0x0;
        pQVar3 = (QAction *)0x0;
      }
      else {
        if (*(int *)(pDVar1 + 4) == 0) {
          pQVar3 = (QAction *)0x0;
        }
        else {
          pQVar3 = (QAction *)(this->syncAction).wp.value;
        }
        (this->syncAction).wp.d = (Data *)0x0;
        (this->syncAction).wp.value = (QObject *)0x0;
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
      }
      this->eventLoop = (QEventLoop *)0x0;
      pDVar1 = (this->popupScreen).wp.d;
      (this->popupScreen).wp.d = (Data *)0x0;
      (this->popupScreen).wp.value = (QObject *)0x0;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
      }
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  QEventLoop::~QEventLoop((QEventLoop *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenuPrivate::exec(const QPoint &p, QAction *action, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    q->ensurePolished();
    q->createWinId();
    QEventLoop evtLoop;
    eventLoop = &evtLoop;
    popup(p, action, positionFunction);

    QPointer<QObject> guard = q;
    if (eventLoop) // popup might have reset if there was nothing to show
        (void)eventLoop->exec();
    if (guard.isNull())
        return nullptr;

    action = syncAction;
    syncAction = nullptr;
    eventLoop = nullptr;
    popupScreen.clear();
    return action;
}